

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O0

art_node_t * art_node_erase(art_inner_node_t *node,art_key_chunk_t key_chunk)

{
  uint8_t uVar1;
  undefined1 in_SIL;
  art_inner_node_t *in_RDI;
  art_key_chunk_t unaff_retaddr;
  art_node4_t *in_stack_00000008;
  undefined7 in_stack_ffffffffffffffe8;
  art_node16_t *in_stack_fffffffffffffff8;
  art_node_t *paVar2;
  
  uVar1 = art_get_type(in_RDI);
  switch(uVar1) {
  case '\0':
    paVar2 = art_node4_erase(in_stack_00000008,unaff_retaddr);
    break;
  case '\x01':
    paVar2 = art_node16_erase(in_stack_fffffffffffffff8,(uint8_t)((ulong)in_RDI >> 0x38));
    break;
  case '\x02':
    paVar2 = art_node48_erase((art_node48_t *)CONCAT17(in_SIL,in_stack_ffffffffffffffe8),'\0');
    break;
  case '\x03':
    paVar2 = art_node256_erase((art_node256_t *)CONCAT17(in_SIL,in_stack_ffffffffffffffe8),'\0');
    break;
  default:
    paVar2 = (art_node_t *)0x0;
  }
  return paVar2;
}

Assistant:

static art_node_t *art_node_erase(art_inner_node_t *node,
                                  art_key_chunk_t key_chunk) {
    switch (art_get_type(node)) {
        case ART_NODE4_TYPE:
            return art_node4_erase((art_node4_t *)node, key_chunk);
        case ART_NODE16_TYPE:
            return art_node16_erase((art_node16_t *)node, key_chunk);
        case ART_NODE48_TYPE:
            return art_node48_erase((art_node48_t *)node, key_chunk);
        case ART_NODE256_TYPE:
            return art_node256_erase((art_node256_t *)node, key_chunk);
        default:
            assert(false);
            return NULL;
    }
}